

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglQueryConfigTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::GetConfigAttribSimpleCase::checkSurfaceTypeMask
          (GetConfigAttribSimpleCase *this,EGLint value)

{
  MessageBuilder *this_00;
  MessageBuilder local_1a0;
  TestLog *local_20;
  TestLog *log;
  EGLint wantedBits;
  EGLint value_local;
  GetConfigAttribSimpleCase *this_local;
  
  log._0_4_ = 7;
  if ((value & 7U) == 0) {
    log._4_4_ = value;
    _wantedBits = this;
    local_20 = tcu::TestContext::getLog
                         ((this->super_GetConfigAttribCase).super_TestCase.super_TestCase.
                          super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1a0,local_20,(BeginMessageToken *)&tcu::TestLog::Message);
    this_00 = tcu::MessageBuilder::operator<<
                        (&local_1a0,
                         (char (*) [69])
                         "Fail, config does not actually support creation of any surface type?");
    tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a0);
    tcu::TestContext::setTestResult
              ((this->super_GetConfigAttribCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,QP_TEST_RESULT_FAIL,"Invalid value");
  }
  return;
}

Assistant:

void checkSurfaceTypeMask (EGLint value)
	{
		const EGLint	wantedBits	= EGL_WINDOW_BIT | EGL_PIXMAP_BIT | EGL_PBUFFER_BIT;

		if ((value & wantedBits) == 0)
		{
			TestLog&	log	= m_testCtx.getLog();

			log << TestLog::Message << "Fail, config does not actually support creation of any surface type?" << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid value");
		}
	}